

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

__ssize_t __thiscall
httplib::detail::stream_line_reader::getline
          (stream_line_reader *this,char **__lineptr,size_t *__n,FILE *__stream)

{
  int iVar1;
  int extraout_var;
  ssize_t n;
  char byte;
  size_t i;
  char in_stack_ffffffffffffffcf;
  char local_19;
  long local_18;
  stream_line_reader *local_10;
  undefined1 local_1;
  ulong uVar2;
  
  this->fixed_buffer_used_size_ = 0;
  local_10 = this;
  std::__cxx11::string::clear();
  local_18 = 0;
  do {
    iVar1 = (*this->strm_->_vptr_Stream[4])(this->strm_,&local_19,1);
    uVar2 = CONCAT44(extraout_var,iVar1);
    if (extraout_var < 0) {
      local_1 = 0;
LAB_001a10a6:
      return CONCAT71((int7)(uVar2 >> 8),local_1);
    }
    if (uVar2 == 0) {
      if (local_18 == 0) {
        local_1 = 0;
      }
      else {
LAB_001a10a1:
        local_1 = 1;
      }
      goto LAB_001a10a6;
    }
    append(this,in_stack_ffffffffffffffcf);
    uVar2 = (ulong)(uint)(int)local_19;
    if ((int)local_19 == 10) goto LAB_001a10a1;
    local_18 = local_18 + 1;
  } while( true );
}

Assistant:

inline bool stream_line_reader::getline() {
  fixed_buffer_used_size_ = 0;
  glowable_buffer_.clear();

  for (size_t i = 0;; i++) {
    char byte;
    auto n = strm_.read(&byte, 1);

    if (n < 0) {
      return false;
    } else if (n == 0) {
      if (i == 0) {
        return false;
      } else {
        break;
      }
    }

    append(byte);

    if (byte == '\n') { break; }
  }

  return true;
}